

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFileItem.cpp
# Opt level: O0

void __thiscall DatUnpacker::DatFileItem::~DatFileItem(DatFileItem *this)

{
  DatFileItem *this_local;
  
  if (this->_packedData != (uchar *)0x0) {
    operator_delete__(this->_packedData);
  }
  this->_packedData = (uchar *)0x0;
  if (this->_unpackedData != (uchar *)0x0) {
    operator_delete__(this->_unpackedData);
  }
  this->_unpackedData = (uchar *)0x0;
  std::__cxx11::string::~string((string *)&this->_name);
  return;
}

Assistant:

DatFileItem::~DatFileItem()
    {
        delete [] _packedData; _packedData = 0;
        delete [] _unpackedData; _unpackedData = 0;

    }